

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_1d_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1f8c447::
BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int),_unsigned_char>
::Common(BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int),_unsigned_char>
         *this,int block_size)

{
  ACMRandom *this_00;
  undefined8 *puVar1;
  uint32_t uVar2;
  int iVar3;
  uchar *puVar4;
  uchar *puVar5;
  uint uVar6;
  SEARCH_METHODS *message;
  int iVar7;
  int iVar8;
  AssertHelper local_50;
  Message local_48;
  undefined8 *local_40;
  AssertHelper local_38;
  
  this->w_ = (uint)::block_size_wide[block_size];
  this->h_ = (uint)::block_size_high[block_size];
  this_00 = &(this->
             super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int)>
             ).rng_;
  uVar2 = testing::internal::Random::Generate(&this_00->random_,0x21);
  this->dst_offset_ = uVar2;
  uVar2 = testing::internal::Random::Generate(&this_00->random_,0x281 - this->w_);
  this->dst_stride_ = uVar2 + this->w_;
  uVar2 = testing::internal::Random::Generate(&this_00->random_,0x21);
  this->src0_offset_ = uVar2;
  uVar2 = testing::internal::Random::Generate(&this_00->random_,0x281 - this->w_);
  this->src0_stride_ = uVar2 + this->w_;
  uVar2 = testing::internal::Random::Generate(&this_00->random_,0x21);
  this->src1_offset_ = uVar2;
  uVar2 = testing::internal::Random::Generate(&this_00->random_,0x281 - this->w_);
  this->src1_stride_ = uVar2 + this->w_;
  uVar2 = testing::internal::Random::Generate(&this_00->random_,3);
  if (uVar2 == 2) {
    puVar5 = this->src0_;
    puVar4 = this->dst_tst_;
    this->src1_stride_ = this->dst_stride_;
    this->src1_offset_ = this->dst_offset_;
  }
  else {
    if (uVar2 == 1) {
      puVar5 = this->dst_tst_;
      this->src0_stride_ = this->dst_stride_;
      this->src0_offset_ = this->dst_offset_;
    }
    else {
      if (uVar2 != 0) {
        testing::Message::Message(&local_48);
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/blend_a64_mask_1d_test.cc"
                   ,0x51,"Failed");
        testing::internal::AssertHelper::operator=(&local_50,&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if ((long *)CONCAT71(local_48.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._1_7_,
                             local_48.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._0_1_) == (long *)0x0) {
          return;
        }
        (**(code **)(*(long *)CONCAT71(local_48.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._1_7_,
                                       local_48.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_1_) + 8))();
        return;
      }
      puVar5 = this->src0_;
    }
    puVar4 = this->src1_;
  }
  (*(this->
    super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int)>
    ).
    super_TestWithParam<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int)>_>
    .super_Test._vptr_Test[6])(this,puVar5,puVar4);
  iVar7 = this->h_;
  if (0 < iVar7) {
    iVar3 = this->w_;
    iVar8 = 0;
    do {
      if (0 < iVar3) {
        iVar7 = 0;
        do {
          uVar6 = this->dst_stride_ * iVar8 + this->dst_offset_ + iVar7;
          testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                    ((internal *)&local_48,"dst_ref_[dst_offset_ + r * dst_stride_ + c]",
                     "dst_tst_[dst_offset_ + r * dst_stride_ + c]",this->dst_ref_ + uVar6,
                     this->dst_tst_ + uVar6);
          puVar1 = local_40;
          if (local_48.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_50);
            if (local_40 == (undefined8 *)0x0) {
              message = "";
            }
            else {
              message = (SEARCH_METHODS *)*local_40;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_38,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/blend_a64_mask_1d_test.cc"
                       ,0x59,(char *)message);
            testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
            testing::internal::AssertHelper::~AssertHelper(&local_38);
            if (local_50.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_50.data_ + 8))();
            }
            if (local_40 == (undefined8 *)0x0) {
              return;
            }
            if ((undefined8 *)*local_40 != local_40 + 2) {
              operator_delete((undefined8 *)*local_40);
            }
            operator_delete(local_40);
            return;
          }
          if (local_40 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_40 != local_40 + 2) {
              operator_delete((undefined8 *)*local_40);
            }
            operator_delete(puVar1);
          }
          iVar7 = iVar7 + 1;
          iVar3 = this->w_;
        } while (iVar7 < iVar3);
        iVar7 = this->h_;
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < iVar7);
  }
  return;
}

Assistant:

void Common(int block_size) {
    w_ = block_size_wide[block_size];
    h_ = block_size_high[block_size];

    dst_offset_ = this->rng_(33);
    dst_stride_ = this->rng_(kMaxWidth + 1 - w_) + w_;

    src0_offset_ = this->rng_(33);
    src0_stride_ = this->rng_(kMaxWidth + 1 - w_) + w_;

    src1_offset_ = this->rng_(33);
    src1_stride_ = this->rng_(kMaxWidth + 1 - w_) + w_;

    T *p_src0;
    T *p_src1;

    switch (this->rng_(3)) {
      case 0:  // Separate sources
        p_src0 = src0_;
        p_src1 = src1_;
        break;
      case 1:  // src0 == dst
        p_src0 = dst_tst_;
        src0_stride_ = dst_stride_;
        src0_offset_ = dst_offset_;
        p_src1 = src1_;
        break;
      case 2:  // src1 == dst
        p_src0 = src0_;
        p_src1 = dst_tst_;
        src1_stride_ = dst_stride_;
        src1_offset_ = dst_offset_;
        break;
      default: FAIL();
    }

    Execute(p_src0, p_src1);

    for (int r = 0; r < h_; ++r) {
      for (int c = 0; c < w_; ++c) {
        ASSERT_EQ(dst_ref_[dst_offset_ + r * dst_stride_ + c],
                  dst_tst_[dst_offset_ + r * dst_stride_ + c]);
      }
    }
  }